

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::ExtensionSet::GetRawRepeatedField
          (ExtensionSet *this,int number,void *default_value)

{
  Extension *pEVar1;
  void *in_RDX;
  undefined8 in_RDI;
  Extension *extension;
  ExtensionSet *in_stack_fffffffffffffff8;
  
  pEVar1 = FindOrNull(in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20));
  if (pEVar1 != (Extension *)0x0) {
    in_RDX = (void *)(pEVar1->field_0).int64_value;
  }
  return in_RDX;
}

Assistant:

const void* ExtensionSet::GetRawRepeatedField(int number,
                                              const void* default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == NULL) {
    return default_value;
  }
  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->repeated_int32_value;
}